

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preferences.cpp
# Opt level: O2

bool __thiscall f8n::prefs::Preferences::GetBool(Preferences *this,char *key,bool defaultValue)

{
  int iVar1;
  undefined7 in_register_00000011;
  allocator<char> local_39;
  string local_38 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_38,key,&local_39);
  iVar1 = (*(this->super_IPreferences)._vptr_IPreferences[10])
                    (this,local_38,CONCAT71(in_register_00000011,defaultValue) & 0xffffffff);
  std::__cxx11::string::~string(local_38);
  return SUB41(iVar1,0);
}

Assistant:

bool Preferences::GetBool(const char* key, bool defaultValue) {
    return this->GetBool(std::string(key), defaultValue);
}